

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.c
# Opt level: O1

void fits_setup_shape(RgnShape *newShape)

{
  double dVar1;
  shapeType sVar2;
  anon_union_120_2_131c4ffb_for_param *paVar3;
  ulong uVar4;
  ulong uVar5;
  anon_union_120_2_131c4ffb_for_param *paVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  
  if (newShape->shape == poly_rgn) {
    paVar6 = (anon_union_120_2_131c4ffb_for_param *)(newShape->param).poly.Pts;
  }
  else {
    paVar6 = &newShape->param;
  }
  switch(newShape->shape) {
  case line_rgn:
    dVar8 = (paVar6->gen).p[2] - (paVar6->gen).p[0];
    dVar9 = (paVar6->gen).p[3] - (paVar6->gen).p[1];
    dVar7 = dVar8 * dVar8 + dVar9 * dVar9;
    if (dVar7 < 0.0) {
      dVar7 = sqrt(dVar7);
    }
    else {
      dVar7 = SQRT(dVar7);
    }
    dVar9 = dVar9 / dVar7;
    if ((dVar7 == 0.0) && (!NAN(dVar7))) {
      dVar9 = 0.0;
    }
    (newShape->param).gen.sinT = dVar9;
    dVar8 = dVar8 / dVar7;
    if ((dVar7 == 0.0) && (!NAN(dVar7))) {
      dVar8 = 1.0;
    }
    (newShape->param).gen.cosT = dVar8;
    dVar7 = dVar7 + 0.5;
    goto LAB_001fdba5;
  case circle_rgn:
    dVar7 = (paVar6->gen).p[2] * (paVar6->gen).p[2];
LAB_001fdba5:
    (newShape->param).gen.a = dVar7;
    break;
  case annulus_rgn:
    (newShape->param).gen.a = (paVar6->gen).p[2] * (paVar6->gen).p[2];
    (newShape->param).gen.b = (paVar6->gen).p[3] * (paVar6->gen).p[3];
    break;
  case ellipse_rgn:
  case box_rgn:
  case diamond_rgn:
    dVar7 = sin(((paVar6->gen).p[4] / 180.0) * 3.141592653589793);
    (newShape->param).gen.sinT = dVar7;
    dVar7 = (paVar6->gen).p[4];
    goto LAB_001fd850;
  case elliptannulus_rgn:
  case boxannulus_rgn:
    dVar7 = sin(((paVar6->gen).p[6] / 180.0) * 3.141592653589793);
    (newShape->param).gen.a = dVar7;
    dVar7 = cos(((paVar6->gen).p[6] / 180.0) * 3.141592653589793);
    (newShape->param).gen.b = dVar7;
    dVar7 = sin(((paVar6->gen).p[7] / 180.0) * 3.141592653589793);
    (newShape->param).gen.sinT = dVar7;
    dVar7 = (paVar6->gen).p[7];
    goto LAB_001fd850;
  case rectangle_rgn:
    dVar7 = sin(((paVar6->gen).p[4] / 180.0) * 3.141592653589793);
    (newShape->param).gen.sinT = dVar7;
    dVar8 = cos(((paVar6->gen).p[4] / 180.0) * 3.141592653589793);
    (newShape->param).gen.cosT = dVar8;
    dVar9 = ((paVar6->gen).p[2] - (paVar6->gen).p[0]) * 0.5;
    dVar10 = ((paVar6->gen).p[3] - (paVar6->gen).p[1]) * 0.5;
    dVar7 = (newShape->param).gen.sinT;
    (newShape->param).gen.a = ABS(dVar9 * dVar8 + dVar7 * dVar10);
    (newShape->param).gen.b = ABS(dVar10 * dVar8 - dVar7 * dVar9);
    (newShape->param).gen.p[5] = ((paVar6->gen).p[2] + (paVar6->gen).p[0]) * 0.5;
    (newShape->param).gen.p[6] = ((paVar6->gen).p[3] + (paVar6->gen).p[1]) * 0.5;
    break;
  case sector_rgn:
    dVar7 = (paVar6->gen).p[2];
    if (180.0 < dVar7) {
      do {
        dVar7 = dVar7 + -360.0;
      } while (180.0 < dVar7);
      (paVar6->gen).p[2] = dVar7;
    }
    dVar7 = (paVar6->gen).p[2];
    if (dVar7 <= -180.0) {
      do {
        dVar7 = dVar7 + 360.0;
      } while (dVar7 <= -180.0);
      (paVar6->gen).p[2] = dVar7;
    }
    dVar7 = (paVar6->gen).p[3];
    if (180.0 < dVar7) {
      do {
        dVar7 = dVar7 + -360.0;
      } while (180.0 < dVar7);
      (paVar6->gen).p[3] = dVar7;
    }
    dVar7 = (paVar6->gen).p[3];
    if (dVar7 <= -180.0) {
      do {
        dVar7 = dVar7 + 360.0;
      } while (dVar7 <= -180.0);
      (paVar6->gen).p[3] = dVar7;
    }
    break;
  case panda_rgn:
    dVar7 = (paVar6->gen).p[2];
    if (180.0 < dVar7) {
      do {
        dVar7 = dVar7 + -360.0;
      } while (180.0 < dVar7);
      (paVar6->gen).p[2] = dVar7;
    }
    dVar7 = (paVar6->gen).p[2];
    if (dVar7 <= -180.0) {
      do {
        dVar7 = dVar7 + 360.0;
      } while (dVar7 <= -180.0);
      (paVar6->gen).p[2] = dVar7;
    }
    dVar7 = (paVar6->gen).p[3];
    if (180.0 < dVar7) {
      do {
        dVar7 = dVar7 + -360.0;
      } while (180.0 < dVar7);
      (paVar6->gen).p[3] = dVar7;
    }
    dVar7 = (paVar6->gen).p[3];
    if (dVar7 <= -180.0) {
      do {
        dVar7 = dVar7 + 360.0;
      } while (dVar7 <= -180.0);
      (paVar6->gen).p[3] = dVar7;
    }
    dVar7 = (newShape->param).gen.p[5];
    dVar8 = (newShape->param).gen.p[6];
    (newShape->param).gen.a = dVar7 * dVar7;
    (newShape->param).gen.b = dVar8 * dVar8;
    break;
  case epanda_rgn:
  case bpanda_rgn:
    dVar7 = (paVar6->gen).p[2];
    if (180.0 < dVar7) {
      do {
        dVar7 = dVar7 + -360.0;
      } while (180.0 < dVar7);
      (paVar6->gen).p[2] = dVar7;
    }
    dVar7 = (paVar6->gen).p[2];
    if (dVar7 <= -180.0) {
      do {
        dVar7 = dVar7 + 360.0;
      } while (dVar7 <= -180.0);
      (paVar6->gen).p[2] = dVar7;
    }
    dVar7 = (paVar6->gen).p[3];
    if (180.0 < dVar7) {
      do {
        dVar7 = dVar7 + -360.0;
      } while (180.0 < dVar7);
      (paVar6->gen).p[3] = dVar7;
    }
    dVar7 = (paVar6->gen).p[3];
    if (dVar7 <= -180.0) {
      do {
        dVar7 = dVar7 + 360.0;
      } while (dVar7 <= -180.0);
      (paVar6->gen).p[3] = dVar7;
    }
    dVar7 = sin(((paVar6->gen).p[10] / 180.0) * 3.141592653589793);
    (newShape->param).gen.sinT = dVar7;
    dVar7 = (paVar6->gen).p[10];
LAB_001fd850:
    dVar7 = cos((dVar7 / 180.0) * 3.141592653589793);
    (newShape->param).gen.cosT = dVar7;
  }
  dVar7 = -1.0;
  switch(newShape->shape) {
  case point_rgn:
    dVar7 = 1.0;
    break;
  case circle_rgn:
    dVar7 = (paVar6->gen).p[2];
    break;
  case annulus_rgn:
    dVar7 = (paVar6->gen).p[3];
    break;
  case ellipse_rgn:
    dVar7 = (paVar6->gen).p[2];
    if ((paVar6->gen).p[2] <= (paVar6->gen).p[3]) {
      dVar7 = (paVar6->gen).p[3];
    }
    break;
  case elliptannulus_rgn:
    dVar7 = (paVar6->gen).p[4];
    if ((paVar6->gen).p[4] <= (paVar6->gen).p[5]) {
      dVar7 = (paVar6->gen).p[5];
    }
    break;
  case box_rgn:
    dVar7 = (paVar6->gen).p[2] * (paVar6->gen).p[2] + (paVar6->gen).p[3] * (paVar6->gen).p[3];
    goto LAB_001fdc46;
  case boxannulus_rgn:
    dVar7 = (paVar6->gen).p[4] * (paVar6->gen).p[5];
    goto LAB_001fdc42;
  case diamond_rgn:
    dVar7 = (paVar6->gen).p[2];
    if (dVar7 <= (paVar6->gen).p[3]) {
      dVar7 = (paVar6->gen).p[3] * 0.5;
      break;
    }
    goto LAB_001fdc6f;
  case panda_rgn:
    dVar7 = (paVar6->gen).p[6];
    break;
  case epanda_rgn:
    dVar7 = (paVar6->gen).p[7];
    if ((paVar6->gen).p[7] <= (paVar6->gen).p[8]) {
      dVar7 = (paVar6->gen).p[8];
    }
    break;
  case bpanda_rgn:
    dVar7 = (paVar6->gen).p[7] * (paVar6->gen).p[8];
LAB_001fdc42:
    dVar7 = dVar7 + dVar7;
LAB_001fdc46:
    if (dVar7 < 0.0) {
      dVar7 = sqrt(dVar7);
    }
    else {
      dVar7 = SQRT(dVar7);
    }
LAB_001fdc6f:
    dVar7 = dVar7 * 0.5;
  }
  if (dVar7 <= 0.0) {
    sVar2 = newShape->shape;
    if ((int)sVar2 < 10) {
      if (sVar2 == line_rgn) {
        dVar7 = (paVar6->gen).p[2];
        paVar3 = paVar6;
        if ((paVar6->gen).p[0] <= dVar7) {
          dVar7 = (paVar6->gen).p[0];
          paVar3 = (anon_union_120_2_131c4ffb_for_param *)((paVar6->gen).p + 2);
        }
        newShape->xmin = dVar7;
        newShape->xmax = (paVar3->gen).p[0];
        if ((paVar6->gen).p[1] <= (paVar6->gen).p[3]) {
          newShape->ymin = (paVar6->gen).p[1];
          dVar7 = (paVar6->gen).p[3];
        }
        else {
          newShape->ymin = (paVar6->gen).p[3];
          dVar7 = (paVar6->gen).p[1];
        }
      }
      else {
        if (sVar2 != rectangle_rgn) {
          return;
        }
        dVar7 = (paVar6->gen).p[5] - (paVar6->gen).p[0];
        dVar8 = (paVar6->gen).p[6] - (paVar6->gen).p[1];
        dVar7 = dVar7 * dVar7 + dVar8 * dVar8;
        if (dVar7 < 0.0) {
          dVar7 = sqrt(dVar7);
        }
        else {
          dVar7 = SQRT(dVar7);
        }
        newShape->xmin = (paVar6->gen).p[5] - dVar7;
        newShape->xmax = (paVar6->gen).p[5] + dVar7;
        newShape->ymin = (paVar6->gen).p[6] - dVar7;
        dVar7 = dVar7 + (paVar6->gen).p[6];
      }
    }
    else {
      if (sVar2 != sector_rgn) {
        if (sVar2 != poly_rgn) {
          return;
        }
        newShape->xmin = (paVar6->gen).p[0];
        newShape->xmax = (paVar6->gen).p[0];
        newShape->ymin = (paVar6->gen).p[1];
        newShape->ymax = (paVar6->gen).p[1];
        uVar4 = (ulong)(newShape->param).poly.nPts;
        if ((long)uVar4 < 3) {
          return;
        }
        dVar7 = newShape->xmin;
        dVar8 = newShape->xmax;
        dVar9 = newShape->ymin;
        dVar10 = newShape->ymax;
        uVar5 = 2;
        do {
          dVar1 = *(double *)((long)paVar6 + uVar5 * 8);
          if (dVar1 < dVar7) {
            newShape->xmin = dVar1;
            dVar7 = dVar1;
          }
          dVar1 = *(double *)((long)paVar6 + uVar5 * 8);
          if (dVar8 < dVar1) {
            newShape->xmax = dVar1;
            dVar8 = dVar1;
          }
          dVar1 = *(double *)((long)paVar6 + uVar5 * 8 + 8);
          if (dVar1 < dVar9) {
            newShape->ymin = dVar1;
            dVar9 = dVar1;
          }
          dVar1 = *(double *)((long)paVar6 + uVar5 * 8 + 8);
          if (dVar10 < dVar1) {
            newShape->ymax = dVar1;
            dVar10 = dVar1;
          }
          uVar5 = uVar5 + 2;
        } while (uVar5 < uVar4);
        return;
      }
      newShape->xmin = 1.0;
      newShape->xmax = -1.0;
      newShape->ymin = 1.0;
      dVar7 = -1.0;
    }
  }
  else {
    newShape->xmin = (paVar6->gen).p[0] - dVar7;
    newShape->xmax = (paVar6->gen).p[0] + dVar7;
    newShape->ymin = (paVar6->gen).p[1] - dVar7;
    dVar7 = dVar7 + (paVar6->gen).p[1];
  }
  newShape->ymax = dVar7;
  return;
}

Assistant:

void fits_setup_shape ( RgnShape *newShape)
{
/* Perform some useful calculations now to speed up filter later             */

  double X, Y, R;
  double *coords;
  int i;

  if ( newShape->shape == poly_rgn ) {
    coords = newShape->param.poly.Pts;
  } else {
    coords = newShape->param.gen.p;
  }

  switch( newShape->shape ) {
  case circle_rgn:
    newShape->param.gen.a = coords[2] * coords[2];
    break;
  case annulus_rgn:
    newShape->param.gen.a = coords[2] * coords[2];
    newShape->param.gen.b = coords[3] * coords[3];
    break;
  case sector_rgn:
    while( coords[2]> 180.0 ) coords[2] -= 360.0;
    while( coords[2]<=-180.0 ) coords[2] += 360.0;
    while( coords[3]> 180.0 ) coords[3] -= 360.0;
    while( coords[3]<=-180.0 ) coords[3] += 360.0;
    break;
  case ellipse_rgn:
    newShape->param.gen.sinT = sin( myPI * (coords[4] / 180.0) );
    newShape->param.gen.cosT = cos( myPI * (coords[4] / 180.0) );
    break;
  case elliptannulus_rgn:
    newShape->param.gen.a    = sin( myPI * (coords[6] / 180.0) );
    newShape->param.gen.b    = cos( myPI * (coords[6] / 180.0) );
    newShape->param.gen.sinT = sin( myPI * (coords[7] / 180.0) );
    newShape->param.gen.cosT = cos( myPI * (coords[7] / 180.0) );
    break;
  case box_rgn:
    newShape->param.gen.sinT = sin( myPI * (coords[4] / 180.0) );
    newShape->param.gen.cosT = cos( myPI * (coords[4] / 180.0) );
    break;
  case boxannulus_rgn:
    newShape->param.gen.a    = sin( myPI * (coords[6] / 180.0) );
    newShape->param.gen.b    = cos( myPI * (coords[6] / 180.0) );
    newShape->param.gen.sinT = sin( myPI * (coords[7] / 180.0) );
    newShape->param.gen.cosT = cos( myPI * (coords[7] / 180.0) );
    break;
  case rectangle_rgn:
    newShape->param.gen.sinT = sin( myPI * (coords[4] / 180.0) );
    newShape->param.gen.cosT = cos( myPI * (coords[4] / 180.0) );
    X = 0.5 * ( coords[2]-coords[0] );
    Y = 0.5 * ( coords[3]-coords[1] );
    newShape->param.gen.a = fabs( X * newShape->param.gen.cosT
				  + Y * newShape->param.gen.sinT );
    newShape->param.gen.b = fabs( Y * newShape->param.gen.cosT
				  - X * newShape->param.gen.sinT );
    newShape->param.gen.p[5] = 0.5 * ( coords[2]+coords[0] );
    newShape->param.gen.p[6] = 0.5 * ( coords[3]+coords[1] );
    break;
  case diamond_rgn:
    newShape->param.gen.sinT = sin( myPI * (coords[4] / 180.0) );
    newShape->param.gen.cosT = cos( myPI * (coords[4] / 180.0) );
    break;
  case line_rgn:
    X = coords[2] - coords[0];
    Y = coords[3] - coords[1];
    R = sqrt( X*X + Y*Y );
    newShape->param.gen.sinT = ( R ? Y/R : 0.0 );
    newShape->param.gen.cosT = ( R ? X/R : 1.0 );
    newShape->param.gen.a    = R + 0.5;
    break;
  case panda_rgn:
    while( coords[2]> 180.0 ) coords[2] -= 360.0;
    while( coords[2]<=-180.0 ) coords[2] += 360.0;
    while( coords[3]> 180.0 ) coords[3] -= 360.0;
    while( coords[3]<=-180.0 ) coords[3] += 360.0;
    newShape->param.gen.a = newShape->param.gen.p[5]*newShape->param.gen.p[5];
    newShape->param.gen.b = newShape->param.gen.p[6]*newShape->param.gen.p[6];
    break;
  case epanda_rgn:
  case bpanda_rgn:
    while( coords[2]> 180.0 ) coords[2] -= 360.0;
    while( coords[2]<=-180.0 ) coords[2] += 360.0;
    while( coords[3]> 180.0 ) coords[3] -= 360.0;
    while( coords[3]<=-180.0 ) coords[3] += 360.0;
    newShape->param.gen.sinT = sin( myPI * (coords[10] / 180.0) );
    newShape->param.gen.cosT = cos( myPI * (coords[10] / 180.0) );
    break;
  default:
    break;
  }

  /*  Set the xmin, xmax, ymin, ymax elements of the RgnShape structure */

  /* For everything which has first two parameters as center position just */
  /* find a circle that encompasses the region and use it to set the       */
  /* bounding box                                                          */

  R = -1.0;

  switch ( newShape->shape ) {

  case circle_rgn:
    R = coords[2];
    break;

  case annulus_rgn:
    R = coords[3];
    break;

  case ellipse_rgn:
    if ( coords[2] > coords[3] ) {
      R = coords[2];
    } else {
      R = coords[3];
    }
    break;

  case elliptannulus_rgn:
    if ( coords[4] > coords[5] ) {
      R = coords[4];
    } else {
      R = coords[5];
    }
    break;

  case box_rgn:
    R = sqrt(coords[2]*coords[2]+
	     coords[3]*coords[3])/2.0;
    break;

  case boxannulus_rgn:
    R = sqrt(coords[4]*coords[5]+
	     coords[4]*coords[5])/2.0;
    break;

  case diamond_rgn:
    if ( coords[2] > coords[3] ) {
      R = coords[2]/2.0;
    } else {
      R = coords[3]/2.0;
    }
    break;
    
  case point_rgn:
    R = 1.0;
    break;

  case panda_rgn:
    R = coords[6];
    break;

  case epanda_rgn:
    if ( coords[7] > coords[8] ) {
      R = coords[7];
    } else {
      R = coords[8];
    }
    break;

  case bpanda_rgn:
    R = sqrt(coords[7]*coords[8]+
	     coords[7]*coords[8])/2.0;
    break;

  default:
    break;
  }

  if ( R > 0.0 ) {

    newShape->xmin = coords[0] - R;
    newShape->xmax = coords[0] + R;
    newShape->ymin = coords[1] - R;
    newShape->ymax = coords[1] + R;

    return;

  }

  /* Now do the rest of the shapes that require individual methods */

  switch ( newShape->shape ) {

  case rectangle_rgn:
    R = sqrt((coords[5]-coords[0])*(coords[5]-coords[0])+
	     (coords[6]-coords[1])*(coords[6]-coords[1]));
    newShape->xmin = coords[5] - R;
    newShape->xmax = coords[5] + R;
    newShape->ymin = coords[6] - R;
    newShape->ymax = coords[6] + R;
    break;

  case poly_rgn:
    newShape->xmin = coords[0];
    newShape->xmax = coords[0];
    newShape->ymin = coords[1];
    newShape->ymax = coords[1];
    for( i=2; i < newShape->param.poly.nPts; ) {
      if( newShape->xmin > coords[i] ) /* Min X */
	newShape->xmin = coords[i];
      if( newShape->xmax < coords[i] ) /* Max X */
	newShape->xmax = coords[i];
      i++;
      if( newShape->ymin > coords[i] ) /* Min Y */
	newShape->ymin = coords[i];
      if( newShape->ymax < coords[i] ) /* Max Y */
	newShape->ymax = coords[i];
      i++;
    }
    break;

  case line_rgn:
    if ( coords[0] > coords[2] ) {
      newShape->xmin = coords[2];
      newShape->xmax = coords[0];
    } else {
      newShape->xmin = coords[0];
      newShape->xmax = coords[2];
    }
    if ( coords[1] > coords[3] ) {
      newShape->ymin = coords[3];
      newShape->ymax = coords[1];
    } else {
      newShape->ymin = coords[1];
      newShape->ymax = coords[3];
    }

    break;

    /* sector doesn't have min and max so indicate by setting max < min */

  case sector_rgn:
    newShape->xmin = 1.0;
    newShape->xmax = -1.0;
    newShape->ymin = 1.0;
    newShape->ymax = -1.0;
    break;

  default:
    break;
  }

  return;

}